

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2dae49::PpuTest_nmi_triggered_when_enabled_during_vblank_Test::
~PpuTest_nmi_triggered_when_enabled_during_vblank_Test
          (PpuTest_nmi_triggered_when_enabled_during_vblank_Test *this)

{
  PpuTest_nmi_triggered_when_enabled_during_vblank_Test *this_local;
  
  ~PpuTest_nmi_triggered_when_enabled_during_vblank_Test(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

TEST_F(PpuTest, nmi_triggered_when_enabled_during_vblank) {
    bool triggered = false;
    expected.ctrl = PpuCtrl(0b1000'0000);
    ppu->set_nmi_handler([&] { triggered = true; });

    step_execution(kCyclesPerScanline * 241 + 1);
    ASSERT_FALSE(triggered);

    step_execution(1);
    ASSERT_FALSE(triggered);

    // Trigger nmi by enabling it during vblank.
    ppu->write_byte(0x2000, 0b1000'0000);
    ASSERT_TRUE(triggered);

    triggered = false;

    // Nmi should only be triggered when the bit goes from 0 to 1.
    ppu->write_byte(0x2000, 0b1000'0000);
    ASSERT_FALSE(triggered);
}